

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O1

int read2Dfield(FILE *in,double **field,size_t offX,size_t offY)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  size_t size [2];
  long local_48;
  size_t local_40;
  
  iVar2 = -1;
  if (field != (double **)0x0 && in != (FILE *)0x0) {
    sVar1 = fread(&local_48,8,2,(FILE *)in);
    iVar2 = -1;
    if (1 < sVar1) {
      if (local_48 != 0) {
        lVar3 = 0;
        do {
          sVar1 = fread(field[offX + lVar3] + offY,8,local_40,(FILE *)in);
          if (sVar1 != local_40) {
            return -1;
          }
          lVar3 = lVar3 + 1;
        } while (local_48 != lVar3);
      }
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int read2Dfield (FILE *in, REAL **field, size_t offX, size_t offY)
{
	if (!in || !field)
		return -1;
	size_t size[2];
	if (fread(size,sizeof(size_t),2,in) < 2)
		return -1;
	for (size_t k = 0; k < size[0]; k++) /* Loop over lines */
	{
		if (fread(field[k+offX]+offY,sizeof(REAL),size[1],in) != size[1])
			return -1;
	}
	return 1;
}